

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall GameEngine::generateMap(GameEngine *this)

{
  RandomGenerator *pRVar1;
  Config *pCVar2;
  pair<int,_int> pVar3;
  int32_t width;
  int32_t height;
  int32_t local_2c;
  __shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  pRVar1 = RandomGenerator::getInstance();
  pCVar2 = Config::getInstance();
  pVar3 = Config::getHeight(pCVar2);
  local_2c = RandomGenerator::randNormalInt(pRVar1,pVar3);
  pRVar1 = RandomGenerator::getInstance();
  pCVar2 = Config::getInstance();
  pVar3 = Config::getWidth(pCVar2);
  RandomGenerator::randNormalInt(pRVar1,pVar3);
  std::make_shared<Map,int&,int&>((int *)&local_28,&local_2c);
  std::__shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2> *)this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  Map::generate((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void GameEngine::generateMap() {
  int32_t height = RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHeight());
  int32_t width = RandomGenerator::getInstance().randNormalInt(Config::getInstance().getWidth());

  map = std::make_shared<Map>(height, width);
  map->generate();
}